

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O2

void update_map(Integer **top,Integer **list,Integer **idx,Integer **jdx,void **data,Integer idim,
               Integer jdim,Integer elemsize,Integer *bufsize,Integer *ncnt)

{
  Integer *__ptr;
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  Integer *pIVar5;
  Integer *pIVar6;
  void *pvVar7;
  long lVar8;
  Integer *pIVar9;
  Integer *pIVar10;
  long lVar11;
  long lVar12;
  size_t __size;
  void *__dest;
  long lVar13;
  long *plVar14;
  
  lVar13 = *bufsize;
  lVar4 = lVar13 * 2;
  __size = lVar13 << 4;
  pIVar5 = (Integer *)malloc(__size);
  pIVar6 = (Integer *)malloc(__size);
  pvVar7 = malloc(lVar4 * elemsize);
  lVar8 = 0;
  lVar11 = 0;
  if (0 < lVar4) {
    lVar11 = lVar4;
  }
  for (; lVar11 != lVar8; lVar8 = lVar8 + 1) {
    pIVar6[lVar8] = -1;
  }
  pIVar9 = (Integer *)malloc(__size);
  pIVar10 = (Integer *)malloc(__size);
  lVar11 = 0;
  if (lVar13 < 1) {
    lVar13 = lVar11;
  }
  __ptr = *top;
  lVar8 = 0;
  for (; lVar11 != lVar13; lVar11 = lVar11 + 1) {
    __dest = (void *)(elemsize * lVar8 + (long)pvVar7);
    plVar14 = __ptr + lVar11;
    while (lVar1 = *plVar14, -1 < lVar1) {
      lVar2 = (*idx)[lVar1];
      lVar3 = (*jdx)[lVar1];
      lVar12 = (lVar2 * jdim + lVar3) % lVar4;
      pIVar6[lVar8] = pIVar5[lVar12];
      pIVar5[lVar12] = lVar8;
      pIVar9[lVar8] = lVar2;
      pIVar10[lVar8] = lVar3;
      memcpy(__dest,(void *)(lVar1 * elemsize + (long)*data),elemsize);
      lVar8 = lVar8 + 1;
      __dest = (void *)((long)__dest + elemsize);
      plVar14 = *list + lVar1;
    }
  }
  free(__ptr);
  free(*list);
  free(*idx);
  free(*jdx);
  free(*data);
  *bufsize = lVar4;
  *top = pIVar5;
  *list = pIVar6;
  *idx = pIVar9;
  *jdx = pIVar10;
  *data = pvVar7;
  *ncnt = lVar8;
  return;
}

Assistant:

void update_map(Integer **top, Integer **list, Integer **idx, Integer **jdx,
    void **data, Integer idim, Integer jdim, Integer elemsize,
    Integer *bufsize, Integer *ncnt)
{
  Integer *ttop;
  Integer *tlist;
  Integer *tidx, *tjdx;
  Integer lcnt;
  Integer newsize;
  void *tdata;
  char *nptr;
  char *optr;
  Integer ii,jj;
  newsize = 2*(*bufsize);
  ttop = (Integer*)malloc(newsize*sizeof(Integer));
  tlist = (Integer*)malloc(newsize*sizeof(Integer));
  tdata = malloc(newsize*elemsize);
  lcnt = 0;
  for (ii=0; ii<newsize; ii++) tlist[ii] = -1;
  tidx = (Integer*)malloc(newsize*sizeof(Integer));
  tjdx = (Integer*)malloc(newsize*sizeof(Integer));
  for (ii=0; ii<*bufsize; ii++) {
    jj = (*top)[ii];
    while (jj >= 0) {
      Integer itmp = (*idx)[jj];
      Integer jtmp = (*jdx)[jj];
      Integer index = (jdim*itmp + jtmp)%newsize;
      tlist[lcnt] = ttop[index];
      ttop[index] = lcnt;
      tidx[lcnt] = itmp; 
      tjdx[lcnt] = jtmp; 
      nptr = (char*)tdata + lcnt*elemsize;
      optr = (char*)(*data) + jj*elemsize;
      memcpy(nptr,optr,elemsize);
      jj = (*list)[jj];
      lcnt++;
    }
  }
  free(*top);
  free(*list);
  free(*idx);
  free(*jdx);
  free(*data);
  *bufsize = newsize;
  *top = ttop;
  *list = tlist;
  *idx = tidx;
  *jdx = tjdx;
  *data = tdata;
  *ncnt = lcnt;
}